

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Options::Options
          (Options *this,char variable_delimiter,AnnotationCollector *annotation_collector)

{
  AnnotationCollector *annotation_collector_local;
  char variable_delimiter_local;
  Options *this_local;
  
  this->variable_delimiter = variable_delimiter;
  this->annotation_collector = annotation_collector;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->comment_start,"//");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&this->ignored_comment_start,"//~");
  this->spaces_per_indent = 2;
  std::optional<bool>::optional(&this->enable_codegen_trace);
  return;
}

Assistant:

Options(char variable_delimiter, AnnotationCollector* annotation_collector)
        : variable_delimiter(variable_delimiter),
          annotation_collector(annotation_collector) {}